

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

void xmlXPathCompEqualityExpr(xmlXPathParserContextPtr ctxt)

{
  xmlChar xVar1;
  int ch1;
  xmlChar *pxVar2;
  byte *pbVar3;
  
  xmlXPathCompRelationalExpr(ctxt);
  if (ctxt->error == 0) {
    pbVar3 = ctxt->cur;
    while( true ) {
      if ((0x20 < (ulong)*pbVar3) || ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) == 0)) break;
      ctxt->cur = pbVar3 + 1;
      pbVar3 = pbVar3 + 1;
    }
    while( true ) {
      pxVar2 = ctxt->cur;
      xVar1 = *pxVar2;
      if ((xVar1 != '=') && ((xVar1 != '!' || (pxVar2[1] != '=')))) break;
      ch1 = ctxt->comp->last;
      if (xVar1 != '\0') {
        ctxt->cur = pxVar2 + 1;
      }
      if ((xVar1 != '=') && (*ctxt->cur != '\0')) {
        ctxt->cur = ctxt->cur + 1;
      }
      pbVar3 = ctxt->cur;
      while( true ) {
        if ((0x20 < (ulong)*pbVar3) || ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) == 0)) break;
        ctxt->cur = pbVar3 + 1;
        pbVar3 = pbVar3 + 1;
      }
      xmlXPathCompRelationalExpr(ctxt);
      if (ctxt->error != 0) {
        return;
      }
      xmlXPathCompExprAdd(ctxt,ch1,ctxt->comp->last,XPATH_OP_EQUAL,(uint)(xVar1 == '='),0,0,
                          (void *)0x0,(void *)0x0);
      pbVar3 = ctxt->cur;
      while( true ) {
        if ((0x20 < (ulong)*pbVar3) || ((0x100002600U >> ((ulong)*pbVar3 & 0x3f) & 1) == 0)) break;
        ctxt->cur = pbVar3 + 1;
        pbVar3 = pbVar3 + 1;
      }
    }
  }
  return;
}

Assistant:

static void
xmlXPathCompEqualityExpr(xmlXPathParserContextPtr ctxt) {
    xmlXPathCompRelationalExpr(ctxt);
    CHECK_ERROR;
    SKIP_BLANKS;
    while ((CUR == '=') || ((CUR == '!') && (NXT(1) == '='))) {
	int eq;
	int op1 = ctxt->comp->last;

        if (CUR == '=') eq = 1;
	else eq = 0;
	NEXT;
	if (!eq) NEXT;
	SKIP_BLANKS;
        xmlXPathCompRelationalExpr(ctxt);
	CHECK_ERROR;
	PUSH_BINARY_EXPR(XPATH_OP_EQUAL, op1, ctxt->comp->last, eq, 0);
	SKIP_BLANKS;
    }
}